

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall Assimp::FBX::FBXConverter::ConvertRootNode(FBXConverter *this)

{
  size_type sVar1;
  aiNode *paVar2;
  string unique_name;
  string local_80;
  undefined1 local_60 [32];
  undefined8 uStack_40;
  float local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  float local_24;
  
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  this->out->mRootNode = paVar2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"RootNode","");
  GetUniqueName(this,(string *)local_60,&local_80);
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,CONCAT44(local_60._20_4_,local_60._16_4_) + 1);
  }
  sVar1 = local_80._M_string_length;
  if (local_80._M_string_length < 0x400) {
    paVar2 = this->out->mRootNode;
    (paVar2->mName).length = (ai_uint32)local_80._M_string_length;
    memcpy((paVar2->mName).data,local_80._M_dataplus._M_p,local_80._M_string_length);
    (paVar2->mName).data[sVar1] = '\0';
  }
  local_60._0_4_ = 1.0;
  local_60._4_4_ = 0.0;
  local_60._8_4_ = 0.0;
  local_60._12_4_ = 0.0;
  local_60._16_4_ = 0;
  local_60._20_4_ = 0x3f800000;
  local_60._24_8_ = 0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0.0;
  local_38 = 1.0;
  local_34._0_4_ = 0.0;
  local_34._4_4_ = 0.0;
  uStack_2c._0_4_ = 0.0;
  uStack_2c._4_4_ = 0.0;
  local_24 = 1.0;
  ConvertNodes(this,0,this->out->mRootNode,(aiMatrix4x4 *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void FBXConverter::ConvertRootNode() {
            out->mRootNode = new aiNode();
            std::string unique_name;
            GetUniqueName("RootNode", unique_name);
            out->mRootNode->mName.Set(unique_name);

            // root has ID 0
            ConvertNodes(0L, *out->mRootNode);
        }